

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O3

region * __thiscall
toml::detail::repeat_at_least::scan
          (region *__return_storage_ptr__,repeat_at_least *this,location *loc)

{
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  element_type *peVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  location first;
  location checkpoint;
  region reg;
  location local_128;
  location local_e0;
  region local_98;
  
  location::location(&local_128,loc);
  if (this->length_ != 0) {
    uVar5 = 0;
    do {
      _Var1._M_head_impl =
           (this->other_).scanner_._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_scanner_base[2])(&local_98,_Var1._M_head_impl,loc);
      if (local_98.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        (loc->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_128.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(loc->source_).
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   &local_128.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&loc->source_name_,&local_128.source_name_);
        loc->column_number_ = local_128.column_number_;
        loc->location_ = local_128.location_;
        loc->line_number_ = local_128.line_number_;
        region::region(__return_storage_ptr__);
        region::~region(&local_98);
        goto LAB_00352862;
      }
      region::~region(&local_98);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->length_);
  }
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    do {
      location::location(&local_e0,loc);
      _Var1._M_head_impl =
           (this->other_).scanner_._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_scanner_base[2])(&local_98,_Var1._M_head_impl,loc);
      if (local_98.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        (loc->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_e0.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(loc->source_).
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   &local_e0.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&loc->source_name_,&local_e0.source_name_);
        loc->column_number_ = local_e0.column_number_;
        loc->location_ = local_e0.location_;
        loc->line_number_ = local_e0.line_number_;
        (__return_storage_ptr__->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_128.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (__return_storage_ptr__->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             local_128.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_128.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_128.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_128.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_128.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_128.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        (__return_storage_ptr__->source_name_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->source_name_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->source_name_,
                   local_128.source_name_._M_dataplus._M_p,
                   local_128.source_name_._M_dataplus._M_p + local_128.source_name_._M_string_length
                  );
        __return_storage_ptr__->first_ = local_128.location_;
        __return_storage_ptr__->first_line_ = local_128.line_number_;
        __return_storage_ptr__->first_column_ = local_128.column_number_;
        sVar3 = loc->location_;
        sVar4 = loc->line_number_;
        __return_storage_ptr__->length_ = sVar3 - local_128.location_;
        __return_storage_ptr__->last_ = sVar3;
        __return_storage_ptr__->last_line_ = sVar4;
        __return_storage_ptr__->last_column_ = loc->column_number_;
        region::~region(&local_98);
        location::~location(&local_e0);
        goto LAB_00352862;
      }
      region::~region(&local_98);
      location::~location(&local_e0);
      peVar2 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    } while (loc->location_ <
             (ulong)((long)(peVar2->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_start));
  }
  (__return_storage_ptr__->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_128.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  (__return_storage_ptr__->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_128.source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_128.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_128.source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_128.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_128.source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_128.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->source_name_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->source_name_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->source_name_,local_128.source_name_._M_dataplus._M_p
             ,local_128.source_name_._M_dataplus._M_p + local_128.source_name_._M_string_length);
  __return_storage_ptr__->first_ = local_128.location_;
  __return_storage_ptr__->first_line_ = local_128.line_number_;
  __return_storage_ptr__->first_column_ = local_128.column_number_;
  sVar3 = loc->location_;
  sVar4 = loc->line_number_;
  __return_storage_ptr__->length_ = sVar3 - local_128.location_;
  __return_storage_ptr__->last_ = sVar3;
  __return_storage_ptr__->last_line_ = sVar4;
  __return_storage_ptr__->last_column_ = loc->column_number_;
LAB_00352862:
  location::~location(&local_128);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region repeat_at_least::scan(location& loc) const
{
    const auto first = loc;
    for(std::size_t i=0; i<length_; ++i)
    {
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            loc = first;
            return region{};
        }
    }
    while( ! loc.eof())
    {
        const auto checkpoint = loc;
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            loc = checkpoint;
            return region(first, loc);
        }
    }
    return region(first, loc);
}